

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O2

bool __thiscall
dxil_spv::DXILContainerParser::parse_dxil(DXILContainerParser *this,MemoryStream *stream)

{
  pointer puVar1;
  bool bVar2;
  undefined1 uVar3;
  size_t sVar4;
  void *__buf;
  ssize_t sVar5;
  size_t bitcode_size;
  ProgramHeader program_header;
  MemoryStream substream;
  ProgramHeader PStack_48;
  MemoryStream local_30;
  
  bVar2 = MemoryStream::read<DXIL::ProgramHeader>(stream,&PStack_48);
  uVar3 = 0;
  if ((bVar2) && (PStack_48.dxil_magic == 0x4c495844)) {
    if (PStack_48.bitcode_offset < 0x10) {
      uVar3 = 0;
    }
    else {
      sVar4 = MemoryStream::get_offset(stream);
      bitcode_size = (size_t)PStack_48.bitcode_size;
      MemoryStream::create_substream_bitcode_size
                (&local_30,stream,(PStack_48.bitcode_offset + sVar4) - 0x10,bitcode_size);
      sVar4 = MemoryStream::get_size(&local_30);
      std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::resize
                (&this->dxil_blob,sVar4);
      puVar1 = (this->dxil_blob).
               super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __buf = (void *)MemoryStream::get_size(&local_30);
      sVar5 = MemoryStream::read(&local_30,(int)puVar1,__buf,bitcode_size);
      uVar3 = (undefined1)sVar5;
    }
  }
  return (bool)uVar3;
}

Assistant:

bool DXILContainerParser::parse_dxil(MemoryStream &stream)
{
	DXIL::ProgramHeader program_header;
	if (!stream.read(program_header))
		return false;

	if (static_cast<DXIL::FourCC>(program_header.dxil_magic) != DXIL::FourCC::DXIL)
		return false;

	constexpr uint32_t DxilMagicPad = sizeof(DXIL::ProgramHeader) - offsetof(DXIL::ProgramHeader, dxil_magic);

	if (program_header.bitcode_offset < DxilMagicPad)
		return false;

	auto substream = stream.create_substream_bitcode_size(
		stream.get_offset() + program_header.bitcode_offset - DxilMagicPad,
		program_header.bitcode_size);

	dxil_blob.resize(substream.get_size());
	if (!substream.read(dxil_blob.data(), substream.get_size()))
		return false;

	return true;
}